

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

Formula * Lib::List<Kernel::Formula_*>::pop(List<Kernel::Formula_*> **lst)

{
  List<Kernel::Formula_*> *pLVar1;
  Formula *pFVar2;
  undefined8 *in_RDI;
  Formula *result;
  List<Kernel::Formula_*> *tail;
  size_t in_stack_ffffffffffffffd8;
  
  pLVar1 = List<Kernel::Formula_*>::tail((List<Kernel::Formula_*> *)*in_RDI);
  pFVar2 = head((List<Kernel::Formula_*> *)*in_RDI);
  if ((void *)*in_RDI != (void *)0x0) {
    List<Kernel::Formula*>::operator_delete((void *)*in_RDI,in_stack_ffffffffffffffd8);
  }
  *in_RDI = pLVar1;
  return pFVar2;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }